

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopPeeling::DuplicateAndConnectLoop
          (LoopPeeling *this,LoopCloningResult *clone_results)

{
  iterator ip;
  UnderlyingIterator this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t succ_blk_id;
  CFG *this_01;
  Loop *pLVar3;
  Function *pFVar4;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> *pUVar5;
  BasicBlock *pBVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  reference puVar7;
  anon_class_32_4_e18e45d2 local_150;
  function<void_(spvtools::opt::Instruction_*)> local_130;
  anon_class_8_1_8991fb9c local_110;
  function<void_(unsigned_int_*)> local_108;
  BasicBlock *local_e8;
  BasicBlock *bb;
  const_iterator cStack_d8;
  uint32_t pred_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  anon_class_8_1_5eeef545 aStack_b8;
  uint32_t cloned_loop_exit;
  function<void_(unsigned_int_*)> local_b0;
  BasicBlock *local_90;
  BasicBlock *cloned_header;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_80;
  __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
  local_78;
  __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
  local_70;
  iterator local_68;
  undefined1 local_58 [8];
  iterator it;
  BasicBlock *pre_header;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ordered_loop_blocks;
  DefUseManager *def_use_mgr;
  CFG *cfg;
  LoopCloningResult *clone_results_local;
  LoopPeeling *this_local;
  
  this_01 = IRContext::cfg(this->context_);
  ordered_loop_blocks.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)IRContext::get_def_use_mgr(this->context_);
  bVar1 = CanPeelLoop(this);
  if (!bVar1) {
    __assert_fail("CanPeelLoop() && \"Cannot peel loop!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x35,
                  "void spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(LoopUtils::LoopCloningResult *)"
                 );
  }
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             &pre_header);
  it.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       Loop::GetOrCreatePreHeaderBlock(this->loop_);
  Loop::ComputeLoopStructuredOrder
            (this->loop_,
             (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             &pre_header,false,false);
  pLVar3 = LoopUtils::CloneLoop
                     (&this->loop_utils_,clone_results,
                      (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *)&pre_header);
  this->cloned_loop_ = pLVar3;
  pFVar4 = LoopUtils::GetFunction(&this->loop_utils_);
  uVar2 = BasicBlock::id((BasicBlock *)it.iterator_._M_current);
  _local_58 = Function::FindBlock(pFVar4,uVar2);
  pFVar4 = LoopUtils::GetFunction(&this->loop_utils_);
  local_68 = Function::end(pFVar4);
  bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58,&local_68);
  if (bVar1) {
    pFVar4 = LoopUtils::GetFunction(&this->loop_utils_);
    local_70._M_current =
         (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
         std::
         vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ::begin(&clone_results->cloned_bb_);
    local_78._M_current =
         (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
         std::
         vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ::end(&clone_results->cloned_bb_);
    pUVar5 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
    cloned_header = (BasicBlock *)pUVar5->container_;
    local_80 = (pUVar5->iterator_)._M_current;
    ip.container_ = pUVar5->container_;
    ip.iterator_._M_current = (pUVar5->iterator_)._M_current;
    Function::
    AddBasicBlocks<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>
              (pFVar4,local_70,local_78,ip);
    aStack_b8.cloned_header = Loop::GetHeaderBlock(this->cloned_loop_);
    this_00 = it.iterator_;
    local_90 = aStack_b8.cloned_header;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(spvtools::opt::LoopUtils::LoopCloningResult*)::__0,void>
              ((function<void(unsigned_int*)> *)&local_b0,&stack0xffffffffffffff48);
    BasicBlock::ForEachSuccessorLabel((BasicBlock *)this_00._M_current,&local_b0);
    std::function<void_(unsigned_int_*)>::~function(&local_b0);
    uVar2 = BasicBlock::id((BasicBlock *)it.iterator_._M_current);
    pBVar6 = Loop::GetHeaderBlock(this->loop_);
    succ_blk_id = BasicBlock::id(pBVar6);
    CFG::RemoveEdge(this_01,uVar2,succ_blk_id);
    Loop::SetPreHeaderBlock(this->cloned_loop_,(BasicBlock *)it.iterator_._M_current);
    Loop::SetPreHeaderBlock(this->loop_,(BasicBlock *)0x0);
    __range2._4_4_ = 0;
    pBVar6 = Loop::GetMergeBlock(this->loop_);
    uVar2 = BasicBlock::id(pBVar6);
    this_02 = CFG::preds(this_01,uVar2);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_02);
    cStack_d8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_02);
    do {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff28);
      if (!bVar1) {
        pBVar6 = Loop::GetMergeBlock(this->loop_);
        uVar2 = BasicBlock::id(pBVar6);
        CFG::RemoveNonExistingEdges(this_01,uVar2);
        pBVar6 = Loop::GetHeaderBlock(this->loop_);
        uVar2 = BasicBlock::id(pBVar6);
        CFG::AddEdge(this_01,__range2._4_4_,uVar2);
        pBVar6 = Loop::GetHeaderBlock(this->loop_);
        local_150.cloned_loop_exit = __range2._4_4_;
        local_150.def_use_mgr =
             (DefUseManager *)
             ordered_loop_blocks.
             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_150.clone_results = clone_results;
        local_150.this = this;
        std::function<void(spvtools::opt::Instruction*)>::
        function<spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(spvtools::opt::LoopUtils::LoopCloningResult*)::__2,void>
                  ((function<void(spvtools::opt::Instruction*)> *)&local_130,&local_150);
        BasicBlock::ForEachPhiInst(pBVar6,&local_130,false);
        std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_130);
        pLVar3 = this->cloned_loop_;
        pBVar6 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
        Loop::SetMergeBlock(pLVar3,pBVar6);
        std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
        ~vector((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *
                )&pre_header);
        return;
      }
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      bb._4_4_ = *puVar7;
      bVar1 = Loop::IsInsideLoop(this->loop_,bb._4_4_);
      if (!bVar1) {
        local_e8 = CFG::block(this_01,bb._4_4_);
        if (__range2._4_4_ != 0) {
          __assert_fail("cloned_loop_exit == 0 && \"The loop has multiple exits.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                        ,0x5a,
                        "void spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(LoopUtils::LoopCloningResult *)"
                       );
        }
        __range2._4_4_ = BasicBlock::id(local_e8);
        pBVar6 = local_e8;
        local_110.this = this;
        std::function<void(unsigned_int*)>::
        function<spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(spvtools::opt::LoopUtils::LoopCloningResult*)::__1,void>
                  ((function<void(unsigned_int*)> *)&local_108,&local_110);
        BasicBlock::ForEachSuccessorLabel(pBVar6,&local_108);
        std::function<void_(unsigned_int_*)>::~function(&local_108);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    } while( true );
  }
  __assert_fail("it != loop_utils_.GetFunction()->end() && \"Pre-header not found in the function.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,0x43,
                "void spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(LoopUtils::LoopCloningResult *)"
               );
}

Assistant:

void LoopPeeling::DuplicateAndConnectLoop(
    LoopUtils::LoopCloningResult* clone_results) {
  CFG& cfg = *context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  assert(CanPeelLoop() && "Cannot peel loop!");

  std::vector<BasicBlock*> ordered_loop_blocks;
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* pre_header = loop_->GetOrCreatePreHeaderBlock();

  loop_->ComputeLoopStructuredOrder(&ordered_loop_blocks);

  cloned_loop_ = loop_utils_.CloneLoop(clone_results, ordered_loop_blocks);

  // Add the basic block to the function.
  Function::iterator it =
      loop_utils_.GetFunction()->FindBlock(pre_header->id());
  assert(it != loop_utils_.GetFunction()->end() &&
         "Pre-header not found in the function.");
  loop_utils_.GetFunction()->AddBasicBlocks(
      clone_results->cloned_bb_.begin(), clone_results->cloned_bb_.end(), ++it);

  // Make the |loop_|'s preheader the |cloned_loop_| one.
  BasicBlock* cloned_header = cloned_loop_->GetHeaderBlock();
  pre_header->ForEachSuccessorLabel(
      [cloned_header](uint32_t* succ) { *succ = cloned_header->id(); });

  // Update cfg.
  cfg.RemoveEdge(pre_header->id(), loop_->GetHeaderBlock()->id());
  cloned_loop_->SetPreHeaderBlock(pre_header);
  loop_->SetPreHeaderBlock(nullptr);

  // When cloning the loop, we didn't cloned the merge block, so currently
  // |cloned_loop_| shares the same block as |loop_|.
  // We mutate all branches from |cloned_loop_| block to |loop_|'s merge into a
  // branch to |loop_|'s header (so header will also be the merge of
  // |cloned_loop_|).
  uint32_t cloned_loop_exit = 0;
  for (uint32_t pred_id : cfg.preds(loop_->GetMergeBlock()->id())) {
    if (loop_->IsInsideLoop(pred_id)) continue;
    BasicBlock* bb = cfg.block(pred_id);
    assert(cloned_loop_exit == 0 && "The loop has multiple exits.");
    cloned_loop_exit = bb->id();
    bb->ForEachSuccessorLabel([this](uint32_t* succ) {
      if (*succ == loop_->GetMergeBlock()->id())
        *succ = loop_->GetHeaderBlock()->id();
    });
  }

  // Update cfg.
  cfg.RemoveNonExistingEdges(loop_->GetMergeBlock()->id());
  cfg.AddEdge(cloned_loop_exit, loop_->GetHeaderBlock()->id());

  // Patch the phi of the original loop header:
  //  - Set the loop entry branch to come from the cloned loop exit block;
  //  - Set the initial value of the phi using the corresponding cloned loop
  //    exit values.
  //
  // We patch the iterating value initializers of the original loop using the
  // corresponding cloned loop exit values. Connects the cloned loop iterating
  // values to the original loop. This make sure that the initial value of the
  // second loop starts with the last value of the first loop.
  //
  // For example, loops like:
  //
  // int z = 0;
  // for (int i = 0; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  //
  // Will become:
  //
  // int z = 0;
  // int i = 0;
  // for (; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  // for (; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  loop_->GetHeaderBlock()->ForEachPhiInst([cloned_loop_exit, def_use_mgr,
                                           clone_results,
                                           this](Instruction* phi) {
    for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
      if (!loop_->IsInsideLoop(phi->GetSingleWordInOperand(i + 1))) {
        phi->SetInOperand(i,
                          {clone_results->value_map_.at(
                              exit_value_.at(phi->result_id())->result_id())});
        phi->SetInOperand(i + 1, {cloned_loop_exit});
        def_use_mgr->AnalyzeInstUse(phi);
        return;
      }
    }
  });

  // Force the creation of a new preheader for the original loop and set it as
  // the merge block for the cloned loop.
  // TODO(1841): Handle failure to create pre-header.
  cloned_loop_->SetMergeBlock(loop_->GetOrCreatePreHeaderBlock());
}